

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpheaders.c
# Opt level: O2

HTTP_HEADERS_RESULT HTTPHeaders_GetHeaderCount(HTTP_HEADERS_HANDLE handle,size_t *headerCount)

{
  MAP_RESULT MVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  HTTP_HEADERS_RESULT HVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uVar7;
  char **values;
  char **keys;
  
  if (handle == (HTTP_HEADERS_HANDLE)0x0 || headerCount == (size_t *)0x0) {
    p_Var2 = xlogging_get_log_function();
    HVar4 = HTTP_HEADERS_INVALID_ARG;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return HTTP_HEADERS_INVALID_ARG;
    }
    pcVar5 = "(result = %s%s (%d))";
    iVar3 = 0xda;
    uVar7 = 2;
    pcVar6 = HTTP_HEADERS_RESULTStringStorage[2];
  }
  else {
    MVar1 = Map_GetInternals(handle->headers,&keys,&values,headerCount);
    if (MVar1 == MAP_OK) {
      return HTTP_HEADERS_OK;
    }
    p_Var2 = xlogging_get_log_function();
    HVar4 = HTTP_HEADERS_ERROR;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return HTTP_HEADERS_ERROR;
    }
    pcVar5 = "Map_GetInternals failed, result= %s%s (%d)";
    iVar3 = 0xe6;
    uVar7 = 5;
    pcVar6 = HTTP_HEADERS_RESULTStringStorage[5];
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/httpheaders.c"
            ,"HTTPHeaders_GetHeaderCount",iVar3,1,pcVar5,"",pcVar6,uVar7);
  return HVar4;
}

Assistant:

HTTP_HEADERS_RESULT HTTPHeaders_GetHeaderCount(HTTP_HEADERS_HANDLE handle, size_t* headerCount)
{
    HTTP_HEADERS_RESULT result;
    /*Codes_SRS_HTTP_HEADERS_99_024:[ The function shall return HTTP_HEADERS_INVALID_ARG when an invalid handle is passed.]*/
    /*Codes_SRS_HTTP_HEADERS_99_025:[ The function shall return HTTP_HEADERS_INVALID_ARG when headersCount is NULL.]*/
    if ((handle == NULL) ||
        (headerCount == NULL))
    {
        result = HTTP_HEADERS_INVALID_ARG;
        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTP_HEADERS_RESULT, result));
    }
    else
    {
        HTTP_HEADERS_HANDLE_DATA *handleData = (HTTP_HEADERS_HANDLE_DATA *)handle;
        const char*const* keys;
        const char*const* values;
        /*Codes_SRS_HTTP_HEADERS_99_023:[ Calling this API shall provide the number of stored headers.]*/
        if (Map_GetInternals(handleData->headers, &keys, &values, headerCount) != MAP_OK)
        {
            /*Codes_SRS_HTTP_HEADERS_99_037:[ The function shall return HTTP_HEADERS_ERROR when an internal error occurs.]*/
            result = HTTP_HEADERS_ERROR;
            LogError("Map_GetInternals failed, result= %" PRI_MU_ENUM "", MU_ENUM_VALUE(HTTP_HEADERS_RESULT, result));
        }
        else
        {
            /*Codes_SRS_HTTP_HEADERS_99_026:[ The function shall write in *headersCount the number of currently stored headers and shall return HTTP_HEADERS_OK]*/
            result = HTTP_HEADERS_OK;
        }
    }

    return result;
}